

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

compare_eq_result_container<QList<QUrl>,_QUrl> __thiscall
QList<QUrl>::operator==(QList<QUrl> *this,QList<QUrl> *other)

{
  long lVar1;
  char cVar2;
  QUrl *pQVar3;
  QUrl *pQVar4;
  long lVar5;
  
  lVar5 = (this->d).size;
  lVar1 = (other->d).size;
  if (lVar5 == lVar1) {
    pQVar3 = (this->d).ptr;
    pQVar4 = (other->d).ptr;
    if (pQVar3 == pQVar4) {
      return true;
    }
    if (lVar5 == lVar1) {
      if (lVar5 == 0) {
        return lVar5 == 0;
      }
      cVar2 = comparesEqual(pQVar3,pQVar4);
      if (cVar2 != '\0') {
        lVar5 = lVar5 * 8;
        do {
          lVar5 = lVar5 + -8;
          pQVar4 = pQVar4 + 1;
          pQVar3 = pQVar3 + 1;
          if (lVar5 == 0) {
            return lVar5 == 0;
          }
          cVar2 = comparesEqual(pQVar3,pQVar4);
        } while (cVar2 != '\0');
        return false;
      }
    }
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }